

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall mjs::has_octal_escape_sequence(mjs *this,wstring_view s)

{
  bool bVar1;
  const_iterator pvVar2;
  value_type *ch;
  const_iterator __end1;
  const_iterator __begin1;
  wstring_view *__range1;
  undefined1 auStack_20 [7];
  bool quote;
  wstring_view s_local;
  
  s_local._M_len = s._M_len;
  bVar1 = false;
  _auStack_20 = this;
  __end1 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::begin
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20);
  pvVar2 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::end
                     ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)auStack_20);
  do {
    if (__end1 == pvVar2) {
      return false;
    }
    if (bVar1) {
      bVar1 = is_octal_char((char16_t)*__end1);
      if (bVar1) {
        return true;
      }
      bVar1 = false;
    }
    else if (*__end1 == 0x5c) {
      bVar1 = true;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

bool has_octal_escape_sequence(const std::wstring_view s) {
    bool quote = false;
    for (const auto& ch: s) {
        if (quote) {
            if (is_octal_char(ch)) {
                return true;
            }
            quote = false;
        } else if (ch == '\\') {
            quote = true;
        }
    }
    return false;
}